

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O3

void __thiscall hgdb::json::SymbolTable::VarAssign::handle(VarAssign *this,VarStmt *s)

{
  pointer pcVar1;
  variant_alternative_t<0UL,_variant<Variable,_unsigned_long>_> *__k;
  const_iterator cVar2;
  variant_alternative_t<1UL,_variant<Variable,_unsigned_long>_> *pvVar3;
  char *this_00;
  
  if (*(__index_type *)
       ((long)&(s->var_).super__Variant_base<hgdb::json::Variable,_unsigned_long>.
               super__Move_assign_alias<hgdb::json::Variable,_unsigned_long>.
               super__Copy_assign_alias<hgdb::json::Variable,_unsigned_long>.
               super__Move_ctor_alias<hgdb::json::Variable,_unsigned_long>.
               super__Copy_ctor_alias<hgdb::json::Variable,_unsigned_long>.
               super__Variant_storage_alias<hgdb::json::Variable,_unsigned_long> + 0x58) == '\0') {
    __k = std::get<0ul,hgdb::json::Variable,unsigned_long>(&s->var_);
    cVar2 = std::
            _Hashtable<hgdb::json::Variable,_std::pair<const_hgdb::json::Variable,_unsigned_long>,_std::allocator<std::pair<const_hgdb::json::Variable,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<hgdb::json::Variable>,_hgdb::json::Variable::hash_fn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&this->id_->_M_h,__k);
    if (cVar2.super__Node_iterator_base<std::pair<const_hgdb::json::Variable,_unsigned_long>,_true>.
        _M_cur != (__node_type *)0x0) {
      cVar2 = std::
              _Hashtable<hgdb::json::Variable,_std::pair<const_hgdb::json::Variable,_unsigned_long>,_std::allocator<std::pair<const_hgdb::json::Variable,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<hgdb::json::Variable>,_hgdb::json::Variable::hash_fn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&this->id_->_M_h,__k);
      if (cVar2.
          super__Node_iterator_base<std::pair<const_hgdb::json::Variable,_unsigned_long>,_true>.
          _M_cur != (__node_type *)0x0) {
        std::variant<hgdb::json::Variable,unsigned_long>::operator=
                  ((variant<hgdb::json::Variable,unsigned_long> *)&s->var_,
                   (unsigned_long *)
                   ((long)cVar2.
                          super__Node_iterator_base<std::pair<const_hgdb::json::Variable,_unsigned_long>,_true>
                          ._M_cur + 0x60));
        return;
      }
      this_00 = "_Map_base::at";
      std::__throw_out_of_range("_Map_base::at");
      if (((variant<hgdb::json::Variable,unsigned_long> *)this_00)[0x58] ==
          (variant<hgdb::json::Variable,unsigned_long>)0x1) {
        pcVar1 = (__k->name)._M_dataplus._M_p;
        pvVar3 = std::get<1ul,hgdb::json::Variable,unsigned_long>
                           ((variant<hgdb::json::Variable,_unsigned_long> *)this_00);
        *pvVar3 = (variant_alternative_t<1UL,_variant<Variable,_unsigned_long>_>)pcVar1;
      }
      else {
        std::variant<hgdb::json::Variable,unsigned_long>::emplace<1ul,unsigned_long_const&>
                  ((variant<hgdb::json::Variable,unsigned_long> *)this_00,(unsigned_long *)__k);
      }
      return;
    }
  }
  return;
}

Assistant:

void handle(VarStmt *s) override {
            if (s->var_.index() == 0) {
                auto const &var = std::get<0>(s->var_);
                if (id_.find(var) != id_.end()) {
                    s->var_ = id_.at(var);
                }
            }
        }